

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::JavascriptProxy::GetEnumerator::ProxyOwnkeysEnumerator::MoveAndGetNext
          (ProxyOwnkeysEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type *element;
  uint uVar1;
  JavascriptArray *pJVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  uint extraout_var;
  JavascriptString *propertyKey;
  char16 *pcVar7;
  Var aValue;
  undefined1 local_80 [8];
  PropertyDescriptor desc;
  CharacterBuffer<char16_t> propertyString;
  RecyclableObject *obj;
  
  *propertyId = -1;
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  uVar1 = (((this->trapResult).ptr)->super_ArrayObject).length;
  do {
    if (uVar1 <= this->index) {
      return (JavascriptString *)0;
    }
    pJVar2 = (this->trapResult).ptr;
    this->index = this->index + 1;
    iVar5 = (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    obj = (RecyclableObject *)CONCAT44(extraout_var,iVar5);
    bVar3 = true;
    if ((extraout_var >> 0x10 == 0 && obj != (RecyclableObject *)0x0) &&
       (bVar4 = VarIsImpl<Js::JavascriptString>(obj), bVar4)) {
      propertyKey = VarTo<Js::JavascriptString>(obj);
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_80);
      BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                        ((RecyclableObject *)(this->proxy).ptr,propertyKey,this->scriptContext,
                         (PropertyDescriptor *)local_80);
      pcVar7 = JavascriptString::GetString(propertyKey);
      JavascriptString::GetLength(propertyKey);
      element = &desc.Configurable;
      Memory::Recycler::WBSetBit(element);
      desc._40_8_ = pcVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(element);
      bVar3 = true;
      if ((BVar6 != 0) &&
         (bVar4 = JsUtil::
                  BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Contains((this->visited).ptr,(CharacterBuffer<char16_t> *)element), !bVar4)) {
        JsUtil::
        BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add((this->visited).ptr,(CharacterBuffer<char16_t> *)element);
        bVar4 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_80);
        if (bVar4) {
          aValue = CrossSite::MarshalVar
                             (this->scriptContext,propertyKey,
                              (((((propertyKey->super_RecyclableObject).type.ptr)->javascriptLibrary
                                ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
          propertyString._8_8_ = VarTo<Js::JavascriptString>(aValue);
          bVar3 = false;
        }
      }
    }
  } while (bVar3);
  return (JavascriptString *)propertyString._8_8_;
}

Assistant:

virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
            {
                propertyId = Constants::NoProperty;
                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }
                // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
                // for (let key of Reflect.ownKeys(obj)) {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++) ;
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(proxy, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                      scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
                return nullptr;
            }